

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

int __thiscall xr_entity_factory::init(xr_entity_factory *this,EVP_PKEY_CTX *ctx)

{
  vector<factory_item_base_*,_std::allocator<factory_item_base_*>_> *this_00;
  int extraout_EAX;
  factory_item_base *pfVar1;
  factory_item_base *local_20;
  
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_graph_point>::factory_item
            ((factory_item<xray_re::cse_alife_graph_point> *)pfVar1,"AI_GRAPH");
  this_00 = &this->m_clsids;
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_online_offline_group>::factory_item
            ((factory_item<xray_re::cse_alife_online_offline_group> *)pfVar1,"ON_OFF_G");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_actor>::factory_item((factory_item<xray_re::se_actor> *)pfVar1,"O_ACTOR")
  ;
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_FLESH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_HIMER");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_R");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_human_stalker>::factory_item
            ((factory_item<xray_re::cse_alife_human_stalker> *)pfVar1,"AI_STL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BLOOD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BOAR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_B");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_P");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_psy_dog_phantom>::factory_item
            ((factory_item<xray_re::cse_alife_psy_dog_phantom> *)pfVar1,"AI_DOG_F");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BURER");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_GIANT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_CONTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_POLTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_ZOM");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_FRACT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_SNORK");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_CAT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_TUSH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_creature_phantom>::factory_item
            ((factory_item<xray_re::cse_alife_creature_phantom> *)pfVar1,"AI_PHANT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_trader>::factory_item
            ((factory_item<xray_re::cse_alife_trader> *)pfVar1,"AI_TRADE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_creature_crow>::factory_item
            ((factory_item<xray_re::cse_alife_creature_crow> *)pfVar1,"AI_CROW");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_car>::factory_item
            ((factory_item<xray_re::cse_alife_car> *)pfVar1,"C_NIVA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_helicopter>::factory_item
            ((factory_item<xray_re::cse_alife_helicopter> *)pfVar1,"C_HLCPTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_MBALL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BDROP");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_NEEDL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BAST");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BGRAV");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_DUMMY");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_ZUDA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_THORN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_FBALL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_EBALL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_RHAIR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_GALAN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"ARTEFACT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_WMAGAZ");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_WMAGGL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_FN2000");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_AK74");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_LR300");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_HPSA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_PM");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_FORT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_BINOC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_SHOTGN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_SVD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_SVU");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_RPG7");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_VAL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_VINT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_WALTHR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_USP45");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_GROZA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon> *)pfVar1,"W_KNIFE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_BM16");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_RG6");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"AMMO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_VOG25");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_OG7B");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_M209");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_SCOPE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_SILENC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_GLAUNC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_bolt>::factory_item
            ((factory_item<xray_re::cse_alife_item_bolt> *)pfVar1,"II_BOLT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_MEDKI");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BANDG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_ANTIR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_FOOD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BOTTL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_explosive>::factory_item
            ((factory_item<xray_re::cse_alife_item_explosive> *)pfVar1,"II_EXPLO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_document>::factory_item
            ((factory_item<xray_re::cse_alife_item_document> *)pfVar1,"II_DOC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_ATTCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_SCIE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_STLK");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_MLTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_EXO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_F1");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_RGD5");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"MP_PLBAG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_custom_zone>::factory_item
            ((factory_item<xray_re::cse_alife_custom_zone> *)pfVar1,"Z_ZONE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_MBALD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_MINCER");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_ACIDF");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_GALANT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_RADIO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_BFUZZ");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_RUSTYH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_DEAD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_space_restrictor>::factory_item
            ((factory_item<xray_re::cse_alife_space_restrictor> *)pfVar1,"SCRIPTZN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_smart_zone>::factory_item
            ((factory_item<xray_re::cse_alife_smart_zone> *)pfVar1,"SMRTZONE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_team_base_zone>::factory_item
            ((factory_item<xray_re::cse_alife_team_base_zone> *)pfVar1,"Z_TEAMBS");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_torrid_zone>::factory_item
            ((factory_item<xray_re::cse_alife_torrid_zone> *)pfVar1,"Z_TORRID");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_space_restrictor>::factory_item
            ((factory_item<xray_re::cse_alife_space_restrictor> *)pfVar1,"SPACE_RS");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_AMEBA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_NOGRAV");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_SIMDET");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_torch>::factory_item
            ((factory_item<xray_re::cse_alife_item_torch> *)pfVar1,"D_TORCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_pda>::factory_item
            ((factory_item<xray_re::cse_alife_item_pda> *)pfVar1,"D_PDA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_projector>::factory_item
            ((factory_item<xray_re::cse_alife_object_projector> *)pfVar1,"O_SEARCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_mounted_weapon>::factory_item
            ((factory_item<xray_re::cse_alife_mounted_weapon> *)pfVar1,"W_MOUNTD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_stationary_mgun>::factory_item
            ((factory_item<xray_re::cse_alife_stationary_mgun> *)pfVar1,"W_STMGUN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_hanging_lamp>::factory_item
            ((factory_item<xray_re::cse_alife_object_hanging_lamp> *)pfVar1,"O_HLAMP");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"O_PHYSIC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_dynamic_object_visual>::factory_item
            ((factory_item<xray_re::cse_alife_dynamic_object_visual> *)pfVar1,"SCRPTOBJ");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_breakable>::factory_item
            ((factory_item<xray_re::cse_alife_object_breakable> *)pfVar1,"O_BRKBL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_climable>::factory_item
            ((factory_item<xray_re::cse_alife_object_climable> *)pfVar1,"O_CLMBL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_ph_skeleton_object>::factory_item
            ((factory_item<xray_re::cse_alife_ph_skeleton_object> *)pfVar1,"P_SKELET");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"P_DSTRBL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_inventory_box>::factory_item
            ((factory_item<xray_re::cse_inventory_box> *)pfVar1,"O_INVBOX");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_ELITE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_ADVANC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"D_FLARE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BTTCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"NW_ATTCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_CFIRE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_CTA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"O_DSTR_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_hanging_lamp>::factory_item
            ((factory_item<xray_re::cse_alife_object_hanging_lamp> *)pfVar1,"SO_HLAMP");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_F1_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_RGD5_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_pda>::factory_item
            ((factory_item<xray_re::cse_alife_item_pda> *)pfVar1,"S_PDA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"S_FOOD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"WP_GLAUN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"WP_SILEN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"AMMO_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_VOG25");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_M209");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_OG7B");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_helmet>::factory_item
            ((factory_item<xray_re::cse_alife_item_helmet> *)pfVar1,"E_HLMET");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_explosive>::factory_item
            ((factory_item<xray_re::cse_alife_item_explosive> *)pfVar1,"S_EXPLO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"DET_ELIT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_level_changer>::factory_item
            ((factory_item<xray_re::se_level_changer> *)pfVar1,"LVL_CHNG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_smart_terrain>::factory_item
            ((factory_item<xray_re::se_smart_terrain> *)pfVar1,"SMRTTRRN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_respawn>::factory_item
            ((factory_item<xray_re::se_respawn> *)pfVar1,"RE_SPAWN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_stalker>::factory_item
            ((factory_item<xray_re::se_stalker> *)pfVar1,"AI_STL_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_trader>::factory_item
            ((factory_item<xray_re::se_trader> *)pfVar1,"AI_TRD_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_heli>::factory_item((factory_item<xray_re::se_heli> *)pfVar1,"C_HLCP_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_restrictor>::factory_item
            ((factory_item<xray_re::se_restrictor> *)pfVar1,"SPC_RS_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_physic>::factory_item
            ((factory_item<xray_re::se_physic> *)pfVar1,"O_PHYS_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_artefact>::factory_item
            ((factory_item<xray_re::se_artefact> *)pfVar1,"SCRPTART");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_car>::factory_item((factory_item<xray_re::se_car> *)pfVar1,"SCRPTCAR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BLOOD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BOARW");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_FLESH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_P_DOG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BURER");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CAT_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CHIMS");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CONTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_IZLOM");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_POLTR");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_GIANT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_ZOMBI");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_SNORK");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_TUSHK");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_P");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_F");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_item_torch>::factory_item
            ((factory_item<xray_re::se_item_torch> *)pfVar1,"TORCH_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_outfit>::factory_item
            ((factory_item<xray_re::se_outfit> *)pfVar1,"E_STLK");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_item>::factory_item((factory_item<xray_re::se_item> *)pfVar1,"WP_SCOPE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::se_weapon_magazined_w_gl> *)pfVar1,"WP_AK74");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_LR300");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_BINOC");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_BM16");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::se_weapon_magazined_w_gl> *)pfVar1,"WP_GROZA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_SVD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_HPSA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon>::factory_item
            ((factory_item<xray_re::se_weapon> *)pfVar1,"WP_KNIFE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_PM");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_RG6");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_RPG7");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_SHOTG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_MAGAZ");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_SVU");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_USP45");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_VAL");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_VINT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_WALTH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_visual>::factory_item
            ((factory_item<xray_re::se_zone_visual> *)pfVar1,"ZS_BFUZZ");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_MBALD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_GALAN");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_MINCE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_actor>::factory_item((factory_item<xray_re::se_actor> *)pfVar1,"S_ACTOR")
  ;
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_sim_faction>::factory_item
            ((factory_item<xray_re::se_sim_faction> *)pfVar1,"SFACTION");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_smart_cover>::factory_item
            ((factory_item<xray_re::se_smart_cover> *)pfVar1,"SMRT_C_S");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_anomaly_field>::factory_item
            ((factory_item<xray_re::se_anomaly_field> *)pfVar1,"ANOMFLD1");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_turret_mgun>::factory_item
            ((factory_item<xray_re::se_turret_mgun> *)pfVar1,"TURRETMG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"Z_MINES");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_invbox>::factory_item
            ((factory_item<xray_re::se_invbox> *)pfVar1,"S_INVBOX");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_RADIO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_torrid>::factory_item
            ((factory_item<xray_re::se_zone_torrid> *)pfVar1,"ZS_TORRD");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_ASHTG");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_KARLO");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_RAT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_shelter>::factory_item
            ((factory_item<xray_re::se_shelter> *)pfVar1,"LA_SHELT");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_item>::factory_item((factory_item<xray_re::se_item> *)pfVar1,"IS_ATTCH");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_NOGRA");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_zone_visual>::factory_item
            ((factory_item<xray_re::se_zone_visual> *)pfVar1,"ZS_RUSTY");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_safe>::factory_item((factory_item<xray_re::se_safe> *)pfVar1,"LA_PHSAF");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::se_safe>::factory_item((factory_item<xray_re::se_safe> *)pfVar1,"LA_SAFE");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  pfVar1 = (factory_item_base *)operator_new(0x10);
  factory_item<xray_re::cse_turret_mgun>::factory_item
            ((factory_item<xray_re::cse_turret_mgun> *)pfVar1,"W_TURRET");
  local_20 = pfVar1;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_20);
  std::
  __sort<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,__gnu_cxx::__ops::_Iter_comp_iter<clsid_pred>>
            ((this->m_clsids).
             super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->m_clsids).
             super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return extraout_EAX;
}

Assistant:

void xr_entity_factory::init()
{
	// engine classes
	m_clsids.push_back(new factory_item<cse_alife_graph_point>("AI_GRAPH"));
	m_clsids.push_back(new factory_item<cse_alife_online_offline_group>("ON_OFF_G"));
	m_clsids.push_back(new factory_item<se_actor>("O_ACTOR"));	// was cse_alife_creature_actor in SoC
//	m_clsids.push_back(new factory_item<cse_spectator>("SPECT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FLESH"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_HIMER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_R"));
	m_clsids.push_back(new factory_item<cse_alife_human_stalker>("AI_STL"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BLOOD"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BOAR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_B"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_P"));
	m_clsids.push_back(new factory_item<cse_alife_psy_dog_phantom>("AI_DOG_F"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BURER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_GIANT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CONTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_POLTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_ZOM"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FRACT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_SNORK"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CAT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_TUSH"));
	m_clsids.push_back(new factory_item<cse_alife_creature_phantom>("AI_PHANT"));
	m_clsids.push_back(new factory_item<cse_alife_trader>("AI_TRADE"));
	m_clsids.push_back(new factory_item<cse_alife_creature_crow>("AI_CROW"));
	m_clsids.push_back(new factory_item<cse_alife_car>("C_NIVA"));
	m_clsids.push_back(new factory_item<cse_alife_helicopter>("C_HLCPTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_MBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BDROP"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_NEEDL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BAST"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_DUMMY"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_ZUDA"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_THORN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_FBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_EBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_RHAIR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_GALAN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("ARTEFACT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WMAGAZ"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_WMAGGL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_FN2000"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_AK74"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_LR300"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_HPSA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_PM"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_FORT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_BINOC"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_SHOTGN"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVD"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVU"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_RPG7"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VAL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VINT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WALTHR"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_USP45"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_GROZA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon>("W_KNIFE"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_BM16"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_RG6"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SCOPE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SILENC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_GLAUNC"));
	m_clsids.push_back(new factory_item<cse_alife_item_bolt>("II_BOLT"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_MEDKI"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BANDG"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ANTIR"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BOTTL"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("II_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_document>("II_DOC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_SCIE"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_STLK"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_MLTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_EXO"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_RPG7"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_FAKE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("MP_PLBAG"));
	m_clsids.push_back(new factory_item<cse_alife_custom_zone>("Z_ZONE"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MBALD"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MINCER"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_ACIDF"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_GALANT"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_RADIO"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_BFUZZ"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_RUSTYH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_DEAD"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SCRIPTZN"));
	m_clsids.push_back(new factory_item<cse_alife_smart_zone>("SMRTZONE"));
	m_clsids.push_back(new factory_item<cse_alife_team_base_zone>("Z_TEAMBS"));
	m_clsids.push_back(new factory_item<cse_alife_torrid_zone>("Z_TORRID"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SPACE_RS"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_AMEBA"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_NOGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_SIMDET"));
	m_clsids.push_back(new factory_item<cse_alife_item_torch>("D_TORCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("D_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_object_projector>("O_SEARCH"));
	m_clsids.push_back(new factory_item<cse_alife_mounted_weapon>("W_MOUNTD"));
	m_clsids.push_back(new factory_item<cse_alife_stationary_mgun>("W_STMGUN"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("O_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_PHYSIC"));
	m_clsids.push_back(new factory_item<cse_alife_dynamic_object_visual>("SCRPTOBJ"));
	m_clsids.push_back(new factory_item<cse_alife_object_breakable>("O_BRKBL"));
	m_clsids.push_back(new factory_item<cse_alife_object_climable>("O_CLMBL"));
	m_clsids.push_back(new factory_item<cse_alife_ph_skeleton_object>("P_SKELET"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("P_DSTRBL"));
	m_clsids.push_back(new factory_item<cse_inventory_box>("O_INVBOX"));
	// Clear Sky (including build 3120) engine classes
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ELITE"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ADVANC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("D_FLARE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BTTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item>("NW_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_CFIRE"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_CTA"));

	// CoP new engine classes
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_DSTR_S"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("SO_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("S_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_item>("S_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_GLAUN"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_SILEN"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_helmet>("E_HLMET"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("S_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("DET_ELIT"));

	// script classes
	m_clsids.push_back(new factory_item<se_level_changer>("LVL_CHNG"));	// was cse_alife_level_changer in pre-3502 builds
	m_clsids.push_back(new factory_item<se_smart_terrain>("SMRTTRRN"));
	m_clsids.push_back(new factory_item<se_respawn>("RE_SPAWN"));
//	m_clsids.push_back(new factory_item<cse_switcher>("O_SWITCH"));
	m_clsids.push_back(new factory_item<se_stalker>("AI_STL_S"));
	m_clsids.push_back(new factory_item<se_trader>("AI_TRD_S"));
	m_clsids.push_back(new factory_item<se_heli>("C_HLCP_S"));
	m_clsids.push_back(new factory_item<se_restrictor>("SPC_RS_S"));
	m_clsids.push_back(new factory_item<se_physic>("O_PHYS_S"));
	m_clsids.push_back(new factory_item<se_artefact>("SCRPTART"));
	m_clsids.push_back(new factory_item<se_car>("SCRPTCAR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BLOOD"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BOARW"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_FLESH"));
	m_clsids.push_back(new factory_item<se_monster>("SM_P_DOG"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BURER"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CAT_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CHIMS"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CONTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_IZLOM"));
	m_clsids.push_back(new factory_item<se_monster>("SM_POLTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_GIANT"));
	m_clsids.push_back(new factory_item<se_monster>("SM_ZOMBI"));
	m_clsids.push_back(new factory_item<se_monster>("SM_SNORK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_TUSHK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_P"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_F"));
	m_clsids.push_back(new factory_item<se_item_torch>("TORCH_S"));
	m_clsids.push_back(new factory_item<se_outfit>("E_STLK"));
	m_clsids.push_back(new factory_item<se_item>("WP_SCOPE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_AK74"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_LR300"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_BINOC"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_BM16"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_GROZA"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVD"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_HPSA"));
	m_clsids.push_back(new factory_item<se_weapon>("WP_KNIFE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_PM"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_RG6"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_RPG7"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_SHOTG"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_MAGAZ"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVU"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_USP45"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VAL"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VINT"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_WALTH"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_BFUZZ"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MBALD"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_GALAN"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MINCE"));
	// clear sky script classes
	m_clsids.push_back(new factory_item<se_actor>("S_ACTOR"));			// + CoP
	m_clsids.push_back(new factory_item<se_sim_faction>("SFACTION"));
	m_clsids.push_back(new factory_item<se_smart_cover>("SMRT_C_S"));	// + CoP

	// ZENOBIAN mod script classes
	m_clsids.push_back(new factory_item<se_anomaly_field>("ANOMFLD1"));
	m_clsids.push_back(new factory_item<se_turret_mgun>("TURRETMG"));
	m_clsids.push_back(new factory_item<se_zone_anom>("Z_MINES"));
	
	// CoP new script classes
	m_clsids.push_back(new factory_item<se_invbox>("S_INVBOX"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_RADIO"));
	m_clsids.push_back(new factory_item<se_zone_torrid>("ZS_TORRD"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_ASHTG"));

	//LA new script classes
	m_clsids.push_back(new factory_item<se_monster>("SM_KARLO"));
	m_clsids.push_back(new factory_item<se_monster>("SM_RAT"));
	m_clsids.push_back(new factory_item<se_shelter>("LA_SHELT"));
	m_clsids.push_back(new factory_item<se_item>("IS_ATTCH"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_NOGRA"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_RUSTY"));
	m_clsids.push_back(new factory_item<se_safe>("LA_PHSAF"));
	m_clsids.push_back(new factory_item<se_safe>("LA_SAFE"));
	m_clsids.push_back(new factory_item<cse_turret_mgun>("W_TURRET"));

	// prepare for bisection
	std::sort(m_clsids.begin(), m_clsids.end(), clsid_pred());
}